

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O0

bool __thiscall Am_Value::operator!=(Am_Value *this,Am_Method_Wrapper *test_value)

{
  Am_ID_Tag AVar1;
  uint uVar2;
  bool local_2d;
  Am_Method_Wrapper *test_value_local;
  Am_Value *this_local;
  
  AVar1 = Am_Type_Class(this->type);
  if (AVar1 == 0x3000) {
    this_local._7_1_ = (Am_Method_Wrapper *)(this->value).wrapper_value != test_value;
  }
  else {
    uVar2 = (uint)this->type;
    if ((uVar2 - 2 < 2) || (uVar2 == 9 || uVar2 == 10)) {
      local_2d = (this->value).wrapper_value != (Am_Wrapper *)0x0 ||
                 test_value != (Am_Method_Wrapper *)0x0;
      this_local._7_1_ = local_2d;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
Am_Value::operator!=(Am_Method_Wrapper *test_value) const
{
  if (Am_Type_Class(type) == Am_METHOD)
    return value.method_value != test_value;
  switch (type) {
  case Am_PROC:
  case Am_INT:
  case Am_LONG:
  case Am_VOIDPTR:
    return value.voidptr_value || test_value;
  default:
    return true;
  }
}